

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

matrix4d *
tinyusdz::GetLocalTransform
          (matrix4d *__return_storage_ptr__,Prim *prim,bool *resetXformStack,double t,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  long lVar2;
  anon_union_128_2_293c120a_for_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *paVar3;
  matrix4d *pmVar4;
  byte bVar5;
  bool rxs;
  Xformable *xformable;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  bool local_b9;
  double local_b8;
  Xformable *local_b0;
  undefined1 local_a8 [128];
  char local_28;
  
  bVar5 = 0;
  local_b8 = t;
  bVar1 = IsXformablePrim(prim);
  if (bVar1) {
    if (resetXformStack != (bool *)0x0) {
      *resetXformStack = false;
    }
    local_b0 = (Xformable *)0x0;
    bVar1 = CastToXformable(prim,&local_b0);
    if ((bVar1) && (local_b0 != (Xformable *)0x0)) {
      local_b9 = false;
      Xformable::GetLocalMatrix_abi_cxx11_
                ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((anon_union_128_2_293c120a_for_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                       *)local_a8)->m_value,local_b0,local_b8,tinterp,&local_b9);
      if (local_28 == '\x01') {
        if (resetXformStack != (bool *)0x0) {
          *resetXformStack = local_b9;
        }
        paVar3 = (anon_union_128_2_293c120a_for_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                  *)local_a8;
        pmVar4 = __return_storage_ptr__;
        for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
          pmVar4->m[0][0] = (paVar3->m_value).m[0][0];
          paVar3 = (anon_union_128_2_293c120a_for_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)((long)paVar3 + ((ulong)bVar5 * -2 + 1) * 8);
          pmVar4 = (matrix4d *)((long)pmVar4 + ((ulong)bVar5 * -2 + 1) * 8);
        }
        return __return_storage_ptr__;
      }
      if ((double *)local_a8._0_8_ !=
          (double *)
          ((long)(((anon_union_128_2_293c120a_for_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_a8)->m_value).m + 0x10U)) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
    }
  }
  else if (resetXformStack != (bool *)0x0) {
    *resetXformStack = false;
  }
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d GetLocalTransform(const Prim &prim, bool *resetXformStack,
                                  double t,
                                  value::TimeSampleInterpolationType tinterp) {
  if (!IsXformablePrim(prim)) {
    if (resetXformStack) {
      (*resetXformStack) = false;
    }
    return value::matrix4d::identity();
  }

  // default false
  if (resetXformStack) {
    (*resetXformStack) = false;
  }

  const Xformable *xformable{nullptr};
  if (CastToXformable(prim, &xformable)) {
    if (!xformable) {
      return value::matrix4d::identity();
    }

    value::matrix4d m;
    bool rxs{false};
    nonstd::expected<value::matrix4d, std::string> ret =
        xformable->GetLocalMatrix(t, tinterp, &rxs);
    if (ret) {
      if (resetXformStack) {
        (*resetXformStack) = rxs;
      }
      return ret.value();
    }
  }

  return value::matrix4d::identity();
}